

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O1

bool __thiscall
Fossilize::FeatureFilter::Impl::render_pass2_is_supported(Impl *this,VkRenderPassCreateInfo2 *info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  VkSubpassDescription2 *pVVar2;
  bool bVar3;
  const_iterator cVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  int *piVar8;
  int *piVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  key_type local_70;
  key_type local_50;
  
  if ((info->flags & 0xfffffffd) == 0) {
    if (info->flags == 0) {
      bVar13 = false;
    }
    else {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"VK_QCOM_render_pass_transform","");
      cVar4 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      *)this,&local_50);
      bVar13 = cVar4.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur == (__node_type *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    if (!bVar13) {
      if (this->null_device != false) {
        return true;
      }
      paVar1 = &local_70.field_2;
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"VK_KHR_create_renderpass2","");
      cVar4 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      *)this,&local_70);
      if (cVar4.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        uVar6 = this->api_version;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if (uVar6 < 0x402000) {
          return false;
        }
      }
      else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      bVar13 = pnext_chain_is_supported(this,info->pNext);
      if (bVar13) {
        bVar13 = info->attachmentCount != 0;
        if (bVar13) {
          uVar12 = 0;
          do {
            uVar6 = 0;
            if ((ulong)info->subpassCount != 0) {
              pVVar2 = info->pSubpasses;
              uVar7 = 0;
              uVar6 = 0;
              do {
                if ((ulong)pVVar2[uVar7].colorAttachmentCount != 0) {
                  lVar10 = 0;
                  do {
                    uVar11 = uVar6 | 0x80;
                    if (uVar12 == *(uint *)((long)&(pVVar2[uVar7].pColorAttachments)->attachment +
                                           lVar10)) {
                      uVar6 = uVar11;
                    }
                    if ((pVVar2[uVar7].pResolveAttachments != (VkAttachmentReference2 *)0x0) &&
                       (uVar12 == *(uint *)((long)&(pVVar2[uVar7].pResolveAttachments)->attachment +
                                           lVar10))) {
                      uVar6 = uVar11;
                    }
                    lVar10 = lVar10 + 0x20;
                  } while ((ulong)pVVar2[uVar7].colorAttachmentCount << 5 != lVar10);
                }
                if ((ulong)pVVar2[uVar7].inputAttachmentCount != 0) {
                  lVar10 = 0;
                  do {
                    uVar6 = uVar6 | uVar12 == *(uint *)((long)&(pVVar2[uVar7].pInputAttachments)->
                                                               attachment + lVar10);
                    lVar10 = lVar10 + 0x20;
                  } while ((ulong)pVVar2[uVar7].inputAttachmentCount << 5 != lVar10);
                }
                if ((pVVar2[uVar7].pDepthStencilAttachment != (VkAttachmentReference2 *)0x0) &&
                   (uVar12 == (pVVar2[uVar7].pDepthStencilAttachment)->attachment)) {
                  uVar6 = uVar6 | 0x200;
                }
                piVar8 = (int *)pVVar2[uVar7].pNext;
                for (piVar9 = piVar8; piVar9 != (int *)0x0; piVar9 = *(int **)(piVar9 + 2)) {
                  if (*piVar9 == 0x3b9dd359) goto LAB_00180a16;
                }
                piVar9 = (int *)0x0;
LAB_00180a16:
                if (((piVar9 != (int *)0x0) && (*(long *)(piVar9 + 6) != 0)) &&
                   (uVar12 == *(uint *)(*(long *)(piVar9 + 6) + 0x10))) {
                  uVar6 = uVar6 | 0x200;
                }
                for (; piVar8 != (int *)0x0; piVar8 = *(int **)(piVar8 + 2)) {
                  if (*piVar8 == 0x3b9e3cd0) goto LAB_00180a61;
                }
                piVar8 = (int *)0x0;
LAB_00180a61:
                if (((piVar8 != (int *)0x0) && (*(long *)(piVar8 + 4) != 0)) &&
                   (uVar12 == *(uint *)(*(long *)(piVar8 + 4) + 0x10))) {
                  uVar6 = uVar6 | 0x40000000;
                }
                uVar7 = uVar7 + 1;
              } while (uVar7 != info->subpassCount);
            }
            bVar3 = attachment_description2_is_supported(this,info->pAttachments + uVar12,uVar6);
            if (!bVar3) {
              if (bVar13) {
                return false;
              }
              break;
            }
            uVar12 = uVar12 + 1;
            bVar13 = uVar12 < info->attachmentCount;
          } while (bVar13);
        }
        if (info->subpassCount != 0) {
          lVar10 = 0;
          uVar12 = 0;
          do {
            bVar13 = subpass_description2_is_supported
                               (this,(VkSubpassDescription2 *)
                                     ((long)&info->pSubpasses->sType + lVar10));
            if (!bVar13) {
              return false;
            }
            uVar12 = uVar12 + 1;
            lVar10 = lVar10 + 0x58;
          } while (uVar12 < info->subpassCount);
        }
        if (info->dependencyCount != 0) {
          lVar10 = 0;
          uVar12 = 0;
          do {
            bVar13 = subpass_dependency2_is_supported
                               (this,(VkSubpassDependency2 *)
                                     ((long)&info->pDependencies->sType + lVar10));
            if (!bVar13) {
              return false;
            }
            uVar12 = uVar12 + 1;
            lVar10 = lVar10 + 0x30;
          } while (uVar12 < info->dependencyCount);
        }
        uVar12 = (ulong)info->correlatedViewMaskCount;
        bVar13 = uVar12 == 0;
        if (bVar13) {
          return bVar13;
        }
        uVar6 = (this->props).multiview.maxMultiviewViewCount;
        uVar11 = 0;
        if (uVar6 < 0x20) {
          uVar11 = -1 << ((byte)uVar6 & 0x1f);
        }
        if ((*info->pCorrelatedViewMasks & uVar11) != 0) {
          return bVar13;
        }
        uVar7 = 1;
        do {
          uVar5 = uVar7;
          if (uVar12 == uVar5) break;
          uVar7 = uVar5 + 1;
        } while ((info->pCorrelatedViewMasks[uVar5] & uVar11) == 0);
        return uVar12 <= uVar5;
      }
    }
  }
  return false;
}

Assistant:

bool FeatureFilter::Impl::render_pass2_is_supported(const VkRenderPassCreateInfo2 *info) const
{
	// Only allow flags we recognize and validate.
	constexpr VkRenderPassCreateFlags supported_flags = VK_RENDER_PASS_CREATE_TRANSFORM_BIT_QCOM;
	if ((info->flags & ~supported_flags) != 0)
		return false;

	if ((info->flags & VK_RENDER_PASS_CREATE_TRANSFORM_BIT_QCOM) != 0 &&
	    enabled_extensions.count(VK_QCOM_RENDER_PASS_TRANSFORM_EXTENSION_NAME) == 0)
		return false;

	if (null_device)
		return true;

	if (!enabled_extensions.count(VK_KHR_CREATE_RENDERPASS_2_EXTENSION_NAME) && api_version < VK_API_VERSION_1_2)
		return false;

	if (!pnext_chain_is_supported(info->pNext))
		return false;

	for (uint32_t i = 0; i < info->attachmentCount; i++)
	{
		VkFormatFeatureFlags format_features = 0;

		for (uint32_t j = 0; j < info->subpassCount; j++)
		{
			for (uint32_t k = 0; k < info->pSubpasses[j].colorAttachmentCount; k++)
			{
				if (info->pSubpasses[j].pColorAttachments[k].attachment == i)
					format_features |= VK_FORMAT_FEATURE_COLOR_ATTACHMENT_BIT;

				if (info->pSubpasses[j].pResolveAttachments &&
				    info->pSubpasses[j].pResolveAttachments[k].attachment == i)
				{
					format_features |= VK_FORMAT_FEATURE_COLOR_ATTACHMENT_BIT;
				}
			}

			for (uint32_t k = 0; k < info->pSubpasses[j].inputAttachmentCount; k++)
				if (info->pSubpasses[j].pInputAttachments[k].attachment == i)
					format_features |= VK_FORMAT_FEATURE_SAMPLED_IMAGE_BIT;

			if (info->pSubpasses[j].pDepthStencilAttachment &&
			    info->pSubpasses[j].pDepthStencilAttachment->attachment == i)
			{
				format_features |= VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT;
			}

			auto *ds_resolve = find_pnext<VkSubpassDescriptionDepthStencilResolve>(
					VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE, info->pSubpasses[j].pNext);
			if (ds_resolve &&
			    ds_resolve->pDepthStencilResolveAttachment &&
			    ds_resolve->pDepthStencilResolveAttachment->attachment == i)
			{
				format_features |= VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT;
			}

			auto *rate_attachment = find_pnext<VkFragmentShadingRateAttachmentInfoKHR>(
					VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR, info->pSubpasses[j].pNext);
			if (rate_attachment &&
			    rate_attachment->pFragmentShadingRateAttachment &&
			    rate_attachment->pFragmentShadingRateAttachment->attachment == i)
			{
				format_features |= VK_FORMAT_FEATURE_FRAGMENT_SHADING_RATE_ATTACHMENT_BIT_KHR;
			}
		}

		if (!attachment_description2_is_supported(info->pAttachments[i], format_features))
			return false;
	}

	for (uint32_t i = 0; i < info->subpassCount; i++)
	{
		if (!subpass_description2_is_supported(info->pSubpasses[i]))
			return false;
	}

	for (uint32_t i = 0; i < info->dependencyCount; i++)
	{
		if (!subpass_dependency2_is_supported(info->pDependencies[i]))
			return false;
	}

	for (uint32_t i = 0; i < info->correlatedViewMaskCount; i++)
		if (!multiview_mask_is_supported(info->pCorrelatedViewMasks[i]))
			return false;

	return true;
}